

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

void nsvg__parseTransform(float *xform,char *str)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float t [6];
  float args [1];
  int local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  float local_38;
  float local_34;
  
  xform[0] = 1.0;
  xform[1] = 0.0;
  xform[2] = 0.0;
  xform[3] = 1.0;
  xform[4] = 0.0;
  xform[5] = 0.0;
  if (*str != '\0') {
    do {
      iVar2 = strncmp(str,"matrix",6);
      if (iVar2 == 0) {
        local_7c = 0;
        iVar2 = nsvg__parseTransformArgs(str,&local_58,6,&local_7c);
        if (local_7c == 6) {
          fStack_68 = (float)local_48;
          fStack_64 = (float)((ulong)local_48 >> 0x20);
          local_78 = local_58;
          fStack_74 = fStack_54;
          fStack_70 = fStack_50;
          fStack_6c = fStack_4c;
        }
        goto LAB_00115d07;
      }
      iVar2 = strncmp(str,"translate",9);
      if (iVar2 == 0) {
        local_7c = 0;
        iVar2 = nsvg__parseTransformArgs(str,&local_58,2,&local_7c);
        if (local_7c == 1) {
          fStack_54 = 0.0;
        }
        local_78 = 1.0;
        fStack_6c = 1.0;
        fStack_68 = local_58;
        fStack_64 = fStack_54;
LAB_00115d02:
        fStack_70 = 0.0;
        fStack_74 = 0.0;
LAB_00115d07:
        str = str + iVar2;
        nsvg__xformPremultiply(xform,&local_78);
      }
      else {
        iVar2 = strncmp(str,"scale",5);
        if (iVar2 == 0) {
          local_7c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_58,2,&local_7c);
          if (local_7c == 1) {
            fStack_54 = local_58;
          }
          local_78 = local_58;
          fStack_64 = 0.0;
          fStack_6c = fStack_54;
          fStack_68 = 0.0;
          goto LAB_00115d02;
        }
        iVar2 = strncmp(str,"rotate",6);
        if (iVar2 == 0) {
          local_7c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_58,3,&local_7c);
          iVar1 = local_7c;
          if (local_7c == 1) {
            fStack_54 = 0.0;
            fStack_50 = 0.0;
          }
          local_5c = fStack_54;
          local_60 = fStack_50;
          local_38 = (local_58 / 180.0) * 3.1415927;
          local_34 = cosf(local_38);
          fVar3 = sinf(local_38);
          if (iVar1 < 2) {
            fVar8 = 0.0;
            fVar4 = 0.0;
          }
          else {
            fVar4 = 0.0 - local_5c;
            fVar8 = 0.0 - local_60;
          }
          fVar7 = local_34 - fVar3 * 0.0;
          fVar5 = (fVar4 * local_34 - fVar8 * fVar3) + 0.0;
          fStack_74 = fVar3 + local_34 * 0.0;
          fVar6 = local_34 * 0.0 - fVar3;
          fStack_6c = fVar3 * 0.0 + local_34;
          fStack_64 = fVar4 * fVar3 + fVar8 * local_34 + 0.0;
          local_78 = fVar7;
          fStack_70 = fVar6;
          fStack_68 = fVar5;
          if (1 < iVar1) {
            local_78 = fStack_74 * 0.0 + fVar7;
            fStack_70 = fStack_6c * 0.0 + fVar6;
            fStack_68 = local_5c + fStack_64 * 0.0 + fVar5;
            fStack_74 = fStack_74 + fVar7 * 0.0;
            fStack_6c = fStack_6c + fVar6 * 0.0;
            fStack_64 = local_60 + fVar5 * 0.0 + fStack_64;
          }
          goto LAB_00115d07;
        }
        iVar2 = strncmp(str,"skewX",5);
        if (iVar2 == 0) {
          local_7c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_58,1,&local_7c);
          fStack_70 = tanf((local_58 / 180.0) * 3.1415927);
          local_78 = 1.0;
          fStack_74 = 0.0;
          fStack_6c = 1.0;
          fStack_68 = 0.0;
          fStack_64 = 0.0;
          goto LAB_00115d07;
        }
        iVar2 = strncmp(str,"skewY",5);
        if (iVar2 == 0) {
          local_7c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_58,1,&local_7c);
          fStack_74 = tanf((local_58 / 180.0) * 3.1415927);
          local_78 = 1.0;
          fStack_70 = 0.0;
          fStack_6c = 1.0;
          fStack_68 = 0.0;
          fStack_64 = 0.0;
          goto LAB_00115d07;
        }
        str = str + 1;
      }
    } while (*str != '\0');
  }
  return;
}

Assistant:

static void nsvg__xformIdentity(float* t)
{
	t[0] = 1.0f; t[1] = 0.0f;
	t[2] = 0.0f; t[3] = 1.0f;
	t[4] = 0.0f; t[5] = 0.0f;
}